

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O3

void R_DeinitTranslationTables(void)

{
  FRemapTable *this;
  uint uVar1;
  FRemapTablePtr *pFVar2;
  ulong uVar3;
  long lVar4;
  
  lVar4 = 0;
  do {
    uVar1 = translationtables[lVar4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count;
    if (uVar1 != 0) {
      pFVar2 = translationtables[lVar4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array;
      uVar3 = 0;
      do {
        this = pFVar2[uVar3].Ptr;
        if (this != (FRemapTable *)0x0) {
          FRemapTable::Free(this);
          operator_delete(this,0x20);
          pFVar2 = translationtables[lVar4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array;
          pFVar2[uVar3].Ptr = (FRemapTable *)0x0;
          uVar1 = translationtables[lVar4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar1);
      if (uVar1 != 0) {
        translationtables[lVar4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count = 0;
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xb);
  if (BloodTranslationColors.Count != 0) {
    BloodTranslationColors.Count = 0;
  }
  return;
}

Assistant:

void R_DeinitTranslationTables()
{
	for (int i = 0; i < NUM_TRANSLATION_TABLES; ++i)
	{
		for (unsigned int j = 0; j < translationtables[i].Size(); ++j)
		{
			if (translationtables[i][j] != NULL)
			{
				delete translationtables[i][j];
				translationtables[i][j] = NULL;
			}
		}
		translationtables[i].Clear();
	}
	BloodTranslationColors.Clear();
}